

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

cmServerProtocol *
cmServer::FindMatchingProtocol
          (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *protocols,int major,
          int minor)

{
  pointer ppcVar1;
  int iVar2;
  int extraout_var;
  int extraout_var_00;
  cmServerProtocol *pcVar3;
  pointer ppcVar4;
  cmServerProtocol *pcVar5;
  cmServerProtocol *unaff_R15;
  
  ppcVar1 = (protocols->super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  pcVar5 = (cmServerProtocol *)0x0;
  for (ppcVar4 = (protocols->
                 super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1; ppcVar4 = ppcVar4 + 1
      ) {
    unaff_R15 = *ppcVar4;
    iVar2 = (*unaff_R15->_vptr_cmServerProtocol[2])(unaff_R15);
    if (iVar2 == major) {
      if (extraout_var == minor) break;
      if (pcVar5 != (cmServerProtocol *)0x0) {
        (*pcVar5->_vptr_cmServerProtocol[2])(pcVar5);
        if (extraout_var <= extraout_var_00) goto LAB_0031b144;
      }
      pcVar5 = unaff_R15;
    }
LAB_0031b144:
  }
  pcVar3 = (cmServerProtocol *)0x0;
  if (minor < 0) {
    pcVar3 = pcVar5;
  }
  if (ppcVar4 != ppcVar1) {
    pcVar3 = unaff_R15;
  }
  return pcVar3;
}

Assistant:

cmServerProtocol* cmServer::FindMatchingProtocol(
  const std::vector<cmServerProtocol*>& protocols, int major, int minor)
{
  cmServerProtocol* bestMatch = nullptr;
  for (auto protocol : protocols) {
    auto version = protocol->ProtocolVersion();
    if (major != version.first) {
      continue;
    }
    if (minor == version.second) {
      return protocol;
    }
    if (!bestMatch || bestMatch->ProtocolVersion().second < version.second) {
      bestMatch = protocol;
    }
  }
  return minor < 0 ? bestMatch : nullptr;
}